

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawner.cpp
# Opt level: O1

void __thiscall spawner::Spawner::decodeParam<unsigned_int>(Spawner *this,uint i)

{
  char *__s;
  size_t sVar1;
  
  if (this->mReadSz == 4) {
    __s = this->fmtbuf;
    snprintf(__s,0x4000,(this->tokenFormat)._M_dataplus._M_p,(ulong)*(uint *)this->mReadBuff);
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x100300,__s,sVar1);
    this->mState = Tag;
    this->mReadSz = 0;
  }
  return;
}

Assistant:

void decodeParam(T i)
    {
        if (sizeof(T) == mReadSz)
        {
            std::memcpy(&i, mReadBuff, sizeof(i));
            snprintf(fmtbuf, sizeof(fmtbuf), tokenFormat.c_str(), i);
            // std::cout << "state: " << std::dec << unsigned(mState) << "format: " << tokenFormat.c_str() <<  " value: " << fmtbuf << "\n";
            mSs << fmtbuf;
            mState = State::Tag;
            mReadSz = 0;
        }
    }